

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point.h
# Opt level: O0

void PointBlock<3U>::save(void *b_,BinaryBuffer *bb)

{
  BinaryBuffer *in_RSI;
  Bounds<float> *in_RDI;
  PointBlock<3U> *b;
  
  diy::save<diy::Bounds<float>>(in_RSI,in_RDI);
  diy::save<diy::Bounds<float>>(in_RSI,in_RDI);
  diy::save<std::vector<diy::Point<float,3u>,std::allocator<diy::Point<float,3u>>>>
            (in_RSI,(vector<diy::Point<float,_3U>,_std::allocator<diy::Point<float,_3U>_>_> *)in_RDI
            );
  return;
}

Assistant:

static void     save(const void* b_, diy::BinaryBuffer& bb)
    {
        const PointBlock* b = static_cast<const PointBlock*>(b_);
        diy::save(bb, b->bounds);
        diy::save(bb, b->box);
        diy::save(bb, b->points);
    }